

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_5292d::FileSystemRootNode::touch(FileSystemRootNode *this,string *filename)

{
  char *__path;
  ostream *poVar1;
  bool bVar2;
  allocator local_49;
  string local_48 [36];
  int local_24;
  string *psStack_20;
  int rc;
  string *filename_local;
  FileSystemRootNode *this_local;
  
  psStack_20 = filename;
  filename_local = (string *)this;
  __path = (char *)std::__cxx11::string::c_str();
  local_24 = utimensat(-100,__path,(timespec *)0x0,0);
  bVar2 = local_24 == 0;
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"FileSystem",&local_49);
    poVar1 = GEO::Logger::err((string *)local_48);
    poVar1 = std::operator<<(poVar1,"Could not touch file:");
    poVar1 = std::operator<<(poVar1,(string *)psStack_20);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return bVar2;
}

Assistant:

bool touch(const std::string& filename) override {
#ifdef GEO_OS_APPLE
           {
                struct stat buff;
                int rc = stat(filename.c_str(), &buff); 
                if(rc != 0) {  // FABIEN NOT SURE WE GET THE TOUCH
                    Logger::err("FileSystem")
                        << "Could not touch file:"
                        << filename
                        << std::endl;
		    return false;
                }
		return true;
            }
#else
            {
                int rc = utimensat(
                    AT_FDCWD,
                    filename.c_str(),
                    nullptr,
                    0
                );
                if(rc != 0) {
                    Logger::err("FileSystem")
                        << "Could not touch file:"
                        << filename
                        << std::endl;
		    return false;
                }
		return true;
            }
#endif	    
        }